

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mime.c
# Opt level: O0

CURLcode curl_mime_data(curl_mimepart *part,char *ptr,size_t datasize)

{
  char *pcVar1;
  size_t local_28;
  size_t datasize_local;
  char *ptr_local;
  curl_mimepart *part_local;
  
  if (part == (curl_mimepart *)0x0) {
    part_local._4_4_ = CURLE_BAD_FUNCTION_ARGUMENT;
  }
  else {
    cleanup_part_content(part);
    if (ptr != (char *)0x0) {
      local_28 = datasize;
      if (datasize == 0xffffffffffffffff) {
        local_28 = strlen(ptr);
      }
      pcVar1 = (char *)Curl_memdup0(ptr,local_28);
      part->data = pcVar1;
      if (part->data == (char *)0x0) {
        return CURLE_OUT_OF_MEMORY;
      }
      part->datasize = local_28;
      part->readfunc = mime_mem_read;
      part->seekfunc = mime_mem_seek;
      part->freefunc = mime_mem_free;
      part->flags = part->flags | 4;
      part->kind = MIMEKIND_DATA;
    }
    part_local._4_4_ = CURLE_OK;
  }
  return part_local._4_4_;
}

Assistant:

CURLcode curl_mime_data(curl_mimepart *part,
                        const char *ptr, size_t datasize)
{
  if(!part)
    return CURLE_BAD_FUNCTION_ARGUMENT;

  cleanup_part_content(part);

  if(ptr) {
    if(datasize == CURL_ZERO_TERMINATED)
      datasize = strlen(ptr);

    part->data = Curl_memdup0(ptr, datasize);
    if(!part->data)
      return CURLE_OUT_OF_MEMORY;

    part->datasize = datasize;
    part->readfunc = mime_mem_read;
    part->seekfunc = mime_mem_seek;
    part->freefunc = mime_mem_free;
    part->flags |= MIME_FAST_READ;
    part->kind = MIMEKIND_DATA;
  }

  return CURLE_OK;
}